

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

void __thiscall kratos::PortBundleVisitor::visit(PortBundleVisitor *this,Generator *generator)

{
  long lVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  vector<std::pair<std::__cxx11::string,kratos::Generator*>,std::allocator<std::pair<std::__cxx11::string,kratos::Generator*>>>
  *this_00;
  _Rb_tree_node_base *p_Var4;
  int iVar5;
  int iVar6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> port_name;
  undefined1 local_90 [8];
  shared_ptr<kratos::Port> port;
  
  p_Var4 = (generator->port_bundle_mapping_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var4 ==
        &(generator->port_bundle_mapping_)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    lVar1 = *(long *)(p_Var4 + 2);
    p_Var3 = *(_Rb_tree_node_base **)(lVar1 + 0xd8);
    bVar2 = true;
    bVar7 = false;
    iVar6 = 2;
    while (p_Var3 != (_Rb_tree_node_base *)(lVar1 + 200)) {
      std::__cxx11::string::string((string *)&stack0xffffffffffffff48,(string *)(p_Var3 + 2));
      Generator::get_port((Generator *)local_90,(string *)generator);
      iVar5 = *(int *)((long)local_90 + 0x270);
      if (((bVar7) && (bVar7 = iVar6 != iVar5, iVar5 = iVar6, bVar7)) ||
         (iVar6 = iVar5,
         (long)*(_func_int **)((long)local_90 + 0xa8) - (long)*(_func_int **)((long)local_90 + 0xa0)
         != 4)) {
        bVar2 = false;
        bVar7 = false;
      }
      else {
        bVar7 = *(uint *)*(_func_int **)((long)local_90 + 0xa0) < 2;
        bVar2 = (bool)(bVar2 & bVar7);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&port);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
      if (!bVar7) break;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      bVar7 = true;
    }
    if (((bVar2) && (iVar6 != 2)) && (*(long *)(lVar1 + 0xe8) != 0)) {
      std::__cxx11::string::string((string *)local_90,(string *)(*(long *)(p_Var4 + 2) + 0x10));
      this_00 = (vector<std::pair<std::__cxx11::string,kratos::Generator*>,std::allocator<std::pair<std::__cxx11::string,kratos::Generator*>>>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>_>_>_>
                   ::operator[](&this->bundle_mapping_,(key_type *)local_90);
      std::__cxx11::string::string((string *)&stack0xffffffffffffff48,(string *)(p_Var4 + 1));
      port_name.field_2._8_8_ = generator;
      std::
      vector<std::pair<std::__cxx11::string,kratos::Generator*>,std::allocator<std::pair<std::__cxx11::string,kratos::Generator*>>>
      ::emplace_back<std::pair<std::__cxx11::string,kratos::Generator*>>
                (this_00,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>
                          *)&stack0xffffffffffffff48);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
      std::__cxx11::string::~string((string *)local_90);
    }
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

void visit(Generator* generator) override {
        auto const& mappings = generator->port_bundle_mapping();
        for (auto const& [entry_name, ref] : mappings) {
            const auto& mapping = ref->name_mappings();
            PortDirection dir = PortDirection::InOut;
            bool initialized = false;
            bool same_direction = true;
            for (auto const& iter : mapping) {
                auto port_name = iter.second;
                auto port = generator->get_port(port_name);
                // all the ports have to have the same direction
                if (!initialized) {
                    initialized = true;
                    dir = port->port_direction();
                } else {
                    if (dir != port->port_direction()) {
                        same_direction = false;
                        break;
                    }
                }
                if (port->size().size() != 1 || port->size().front() > 1) {
                    // TODO: upgrade packed struct to support array
                    same_direction = false;
                    break;
                }
            }
            if (same_direction && dir != PortDirection::InOut && !mapping.empty()) {
                // this is the one we need to convert
                auto bundle_name = ref->def_name();
                bundle_mapping_[bundle_name].emplace_back(std::make_pair(entry_name, generator));
            }
        }
    }